

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O0

int idaLs_AccessLMem(void *ida_mem,char *fname,IDAMem *IDA_mem,IDALsMem *idals_mem)

{
  undefined8 *in_RCX;
  long *in_RDX;
  char *in_RSI;
  long in_RDI;
  int local_4;
  
  if (in_RDI == 0) {
    IDAProcessError((IDAMem)0x0,-1,0x70f,in_RSI,
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                    ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else {
    *in_RDX = in_RDI;
    if (*(long *)(*in_RDX + 0x760) == 0) {
      IDAProcessError((IDAMem)*in_RDX,-2,0x716,in_RSI,
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                      ,"Linear solver memory is NULL.");
      local_4 = -2;
    }
    else {
      *in_RCX = *(undefined8 *)(*in_RDX + 0x760);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int idaLs_AccessLMem(void* ida_mem, const char* fname, IDAMem* IDA_mem,
                     IDALsMem* idals_mem)
{
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_IDAMEM_NULL);
    return (IDALS_MEM_NULL);
  }
  *IDA_mem = (IDAMem)ida_mem;
  if ((*IDA_mem)->ida_lmem == NULL)
  {
    IDAProcessError(*IDA_mem, IDALS_LMEM_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_LMEM_NULL);
    return (IDALS_LMEM_NULL);
  }
  *idals_mem = (IDALsMem)(*IDA_mem)->ida_lmem;
  return (IDALS_SUCCESS);
}